

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O1

void anon_unknown.dwarf_e46b9e::ProcessMetadata
               (uint64_t relDefinesByPropertiesID,ConversionData *conv,Metadata *properties)

{
  DB *this;
  LazyObject *pLVar1;
  Object *pOVar2;
  long lVar3;
  IfcPropertySetDefinition *pIVar4;
  uint in_R8D;
  long *local_40 [2];
  long local_30 [2];
  
  pLVar1 = Assimp::STEP::DB::GetObject(conv->db,relDefinesByPropertiesID);
  pOVar2 = Assimp::STEP::LazyObject::operator*(pLVar1);
  lVar3 = __dynamic_cast(pOVar2,&Assimp::STEP::Object::typeinfo,
                         &Assimp::IFC::Schema_2x3::IfcRelDefinesByProperties::typeinfo,
                         0xffffffffffffffff);
  if (lVar3 != 0) {
    this = conv->db;
    pIVar4 = Assimp::STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>
                       (*(LazyObject **)(lVar3 + 0xd0));
    pLVar1 = Assimp::STEP::DB::GetObject
                       (this,*(uint64_t *)
                              ((pIVar4->super_IfcPropertyDefinition).super_IfcRoot.
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                               _vptr_ObjectHelper[-3] +
                              (long)&(pIVar4->super_IfcPropertyDefinition).super_IfcRoot.
                                     super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.
                                     aux_is_derived.super__Base_bitset<1UL>));
    pOVar2 = Assimp::STEP::LazyObject::operator*(pLVar1);
    lVar3 = __dynamic_cast(pOVar2,&Assimp::STEP::Object::typeinfo,
                           &Assimp::IFC::Schema_2x3::IfcPropertySet::typeinfo);
    if (lVar3 != 0) {
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"");
      ProcessMetadata((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL> *)
                      (lVar3 + 0xb8),(ConversionData *)properties,(Metadata *)local_40,(string *)0x0
                      ,in_R8D);
      if (local_40[0] != local_30) {
        operator_delete(local_40[0],local_30[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void ProcessMetadata(uint64_t relDefinesByPropertiesID, ConversionData& conv, Metadata& properties)
{
    if (const Schema_2x3::IfcRelDefinesByProperties* const pset = conv.db.GetObject(relDefinesByPropertiesID)->ToPtr<Schema_2x3::IfcRelDefinesByProperties>()) {
        if (const Schema_2x3::IfcPropertySet* const set = conv.db.GetObject(pset->RelatingPropertyDefinition->GetID())->ToPtr<Schema_2x3::IfcPropertySet>()) {
            ProcessMetadata(set->HasProperties, conv, properties);
        }
    }
}